

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p3p.cc
# Opt level: O2

void lambdatwist::compute_eig3x3known0(Matrix3d *M,Matrix3d *E,double *sig1,double *sig2)

{
  double dVar1;
  double dVar2;
  double dVar3;
  undefined1 auVar4 [16];
  double dVar5;
  double __tmp;
  double dVar6;
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  double dVar10;
  double dVar11;
  
  dVar5 = (M->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array
          [0];
  dVar6 = (M->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array
          [3];
  dVar10 = (M->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array
           [4];
  dVar1 = (M->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array
          [8];
  dVar11 = (-dVar5 - dVar10) - dVar1;
  dVar2 = (M->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array
          [6];
  dVar3 = (M->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array
          [7];
  dVar5 = dVar11 * dVar11 * 0.25 -
          (dVar10 * dVar1 +
          (dVar10 + dVar1) * dVar5 + ((-dVar6 * dVar6 - dVar2 * dVar2) - dVar3 * dVar3));
  if (dVar5 < 0.0) {
    dVar5 = sqrt(dVar5);
  }
  else {
    dVar5 = SQRT(dVar5);
  }
  *sig1 = dVar11 * -0.5 + dVar5;
  dVar5 = dVar11 * -0.5 - dVar5;
  *sig2 = dVar5;
  dVar6 = *sig1;
  if (ABS(dVar6) < ABS(dVar5)) {
    *sig1 = dVar5;
    *sig2 = dVar6;
    dVar6 = *sig1;
  }
  dVar5 = (M->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array
          [4];
  dVar10 = (M->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array
           [0];
  dVar1 = (M->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array
          [3];
  dVar2 = (M->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array
          [6];
  dVar3 = (M->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array
          [7];
  dVar11 = ((dVar6 * dVar6 + dVar10 * dVar5) - (dVar10 + dVar5) * dVar6) - dVar1 * dVar1;
  auVar7._0_8_ = (dVar6 * dVar2 + dVar1 * dVar3) - dVar5 * dVar2;
  auVar7._8_8_ = (dVar6 * dVar3 + dVar2 * dVar1) - dVar3 * dVar10;
  auVar8._8_8_ = dVar11;
  auVar8._0_8_ = dVar11;
  auVar8 = divpd(auVar7,auVar8);
  dVar5 = auVar8._0_8_;
  dVar6 = auVar8._8_8_;
  dVar10 = 1.0 / SQRT(dVar6 * dVar6 + dVar5 * dVar5 + 1.0);
  (E->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[0] =
       dVar10 * dVar5;
  (E->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[1] =
       dVar10 * dVar6;
  (E->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[2] =
       dVar10;
  dVar5 = *sig2;
  dVar6 = (M->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array
          [4];
  dVar10 = (M->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array
           [0];
  dVar2 = (M->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array
          [6];
  dVar3 = (M->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array
          [7];
  dVar1 = (M->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array
          [3];
  dVar11 = ((dVar5 * dVar5 + dVar10 * dVar6) - (dVar10 + dVar6) * dVar5) - dVar1 * dVar1;
  auVar9._0_8_ = (dVar5 * dVar2 + dVar1 * dVar3) - dVar6 * dVar2;
  auVar9._8_8_ = (dVar5 * dVar3 + dVar2 * dVar1) - dVar3 * dVar10;
  auVar4._8_8_ = dVar11;
  auVar4._0_8_ = dVar11;
  auVar8 = divpd(auVar9,auVar4);
  dVar6 = auVar8._0_8_;
  dVar10 = auVar8._8_8_;
  dVar5 = 1.0 / SQRT(dVar10 * dVar10 + dVar6 * dVar6 + 1.0);
  (E->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[3] =
       dVar5 * dVar6;
  (E->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[4] =
       dVar5 * dVar10;
  (E->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[5] =
       dVar5;
  return;
}

Assistant:

void compute_eig3x3known0(const Eigen::Matrix3d &M, Eigen::Matrix3d &E, double &sig1, double &sig2) {

    // In the original paper there is a missing minus sign here (for M(0,0))
    double p1 = -M(0,0) - M(1,1) - M(2,2);
    double p0 = -M(0,1)*M(0,1) - M(0,2)*M(0,2) - M(1,2)*M(1,2) + M(0,0) * (M(1,1) + M(2,2)) + M(1,1)*M(2,2);

    double disc = std::sqrt(p1*p1/4.0 - p0);
    double tmp = -p1/2.0;
    sig1 = tmp + disc;
    sig2 = tmp - disc;

    if(std::abs(sig1) < std::abs(sig2))
        std::swap(sig1,sig2);

    double c = sig1*sig1 + M(0,0)*M(1,1) - sig1 * (M(0,0) + M(1,1)) - M(0,1)*M(0,1);
    double a1 = (sig1 * M(0,2) + M(0,1)*M(1,2) - M(0,2) * M(1,1)) / c;
    double a2 = (sig1 * M(1,2) + M(0,1)*M(0,2) - M(0,0) * M(1,2)) / c;
    double n = 1.0 / std::sqrt(1 + a1*a1 + a2*a2);
    E.col(0) << a1*n, a2*n, n;

    c = sig2*sig2 + M(0,0)*M(1,1) - sig2 * (M(0,0) + M(1,1)) - M(0,1)*M(0,1);
    a1 = (sig2 * M(0,2) + M(0,1)*M(1,2) - M(0,2) * M(1,1)) / c;
    a2 = (sig2 * M(1,2) + M(0,1)*M(0,2) - M(0,0) * M(1,2)) / c;
    n = 1.0 / std::sqrt(1 + a1*a1 + a2*a2);
    E.col(1) << a1*n, a2*n, n;

    // This is never used so we don't compute it
    //E.col(2) = M.col(1).cross(M.col(2)).normalized();
}